

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume_mesh_scalar_quantity.cpp
# Opt level: O2

void __thiscall
polyscope::VolumeMeshVertexScalarQuantity::setLevelSetUniforms
          (VolumeMeshVertexScalarQuantity *this,ShaderProgram *p)

{
  allocator local_51;
  string local_50 [32];
  string local_30 [32];
  
  std::__cxx11::string::string(local_30,"u_sliceVector",&local_51);
  (*p->_vptr_ShaderProgram[9])(SUB648(ZEXT464(0x3f800000),0),0,p,local_30);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::string(local_50,"u_slicePoint",&local_51);
  (*p->_vptr_ShaderProgram[5])((ulong)(uint)this->levelSetValue,p,local_50);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void VolumeMeshVertexScalarQuantity::setLevelSetUniforms(render::ShaderProgram& p) {
  p.setUniform("u_sliceVector", glm::vec3(1, 0, 0));
  p.setUniform("u_slicePoint", levelSetValue);
}